

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall
wasm_tabletype_t::wasm_tabletype_t
          (wasm_tabletype_t *this,wasm_valtype_t *type,wasm_limits_t *limits)

{
  ValueType VVar1;
  undefined1 auVar2 [16];
  ExternType *pEVar3;
  
  pEVar3 = (ExternType *)operator_new(0x30);
  VVar1 = type->I;
  auVar2._8_4_ = (*limits).max;
  auVar2._0_8_ = (ulong)*limits & 0xffffffff;
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])&pEVar3[1].kind = auVar2;
  pEVar3->kind = Table;
  pEVar3->_vptr_ExternType = (_func_int **)&PTR__ExternType_002258c0;
  *(ValueType *)&pEVar3->field_0xc = VVar1;
  *(undefined2 *)&pEVar3[2].kind = Table;
  *(byte *)((long)&pEVar3[2].kind + 2) = 0;
  (this->super_wasm_externtype_t).I._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl = pEVar3;
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_externtype_t_00225c68;
  (this->elemtype).I = type->I;
  this->limits = *limits;
  fprintf(_stderr,"CAPI: [%s] \n","wasm_valtype_delete");
  operator_delete(type,8);
  return;
}

Assistant:

wasm_tabletype_t(own wasm_valtype_t* type, const wasm_limits_t* limits)
      : wasm_externtype_t{std::make_unique<TableType>(type->I,
                                                      ToWabtLimits(*limits))},
        elemtype(*type),
        limits(*limits) {
    wasm_valtype_delete(type);
  }